

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTrig>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTrig> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticTrig> *cp)

{
  void *pvVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,DestMesh,&cp->super_TPZGeoEl);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes +
            *(long *)((long)pvVar1 + -0x60) + -0x48) = vtt[3];
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.super_TPZTriangle.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018a5c88;
  iVar2 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[1];
  iVar3 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[2];
  iVar4 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[3];
  iVar5 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[4];
  iVar6 = (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[5];
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[0] =
       (cp->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[1] = iVar2;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[2] = iVar3;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[3] = iVar4;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[4] = iVar5;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes[5] = iVar6;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZTriangle>.super_TPZTriangle.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticTrig_018a5c00;
  lVar7 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar7) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar7) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar7) = 0xffffffffffffffff;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0xa8);
  lVar7 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar7) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar7);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar7) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar7);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0xa8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}